

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

ServiceDescriptor * perfetto::protos::gen::ConsumerPort::NewDescriptor(void)

{
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  *this;
  ServiceDescriptor *pSVar1;
  pointer pMVar2;
  iterator iVar3;
  Method local_38;
  
  pSVar1 = (ServiceDescriptor *)operator_new(0x20);
  this = &pSVar1->methods;
  (pSVar1->methods).
  super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pSVar1->methods).
  super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pSVar1->methods).
  super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar1->service_name = "ConsumerPort";
  local_38.name = "EnableTracing";
  local_38.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::EnableTracingRequest>;
  local_38.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::EnableTracingResponse>;
  local_38.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::EnableTracingRequest,_perfetto::protos::gen::EnableTracingResponse,_&perfetto::protos::gen::ConsumerPort::EnableTracing>
  ;
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::_M_realloc_insert<perfetto::ipc::ServiceDescriptor::Method>(this,(iterator)0x0,&local_38);
  iVar3._M_current =
       (pSVar1->methods).
       super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_38.name = "DisableTracing";
  local_38.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::DisableTracingRequest>;
  local_38.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::DisableTracingResponse>;
  local_38.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::DisableTracingRequest,_perfetto::protos::gen::DisableTracingResponse,_&perfetto::protos::gen::ConsumerPort::DisableTracing>
  ;
  if (iVar3._M_current ==
      (pSVar1->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ::_M_realloc_insert<perfetto::ipc::ServiceDescriptor::Method>(this,iVar3,&local_38);
    iVar3._M_current =
         (pSVar1->methods).
         super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (iVar3._M_current)->reply_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::DisableTracingResponse>;
    (iVar3._M_current)->invoker =
         _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::DisableTracingRequest,_perfetto::protos::gen::DisableTracingResponse,_&perfetto::protos::gen::ConsumerPort::DisableTracing>
    ;
    (iVar3._M_current)->name = "DisableTracing";
    (iVar3._M_current)->request_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::DisableTracingRequest>;
    iVar3._M_current =
         (pSVar1->methods).
         super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (pSVar1->methods).
    super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_38.name = "ReadBuffers";
  local_38.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::ReadBuffersRequest>;
  local_38.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::ReadBuffersResponse>;
  local_38.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::ReadBuffersRequest,_perfetto::protos::gen::ReadBuffersResponse,_&perfetto::protos::gen::ConsumerPort::ReadBuffers>
  ;
  if (iVar3._M_current ==
      (pSVar1->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ::_M_realloc_insert<perfetto::ipc::ServiceDescriptor::Method>(this,iVar3,&local_38);
    iVar3._M_current =
         (pSVar1->methods).
         super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (iVar3._M_current)->reply_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::ReadBuffersResponse>;
    (iVar3._M_current)->invoker =
         _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::ReadBuffersRequest,_perfetto::protos::gen::ReadBuffersResponse,_&perfetto::protos::gen::ConsumerPort::ReadBuffers>
    ;
    (iVar3._M_current)->name = "ReadBuffers";
    (iVar3._M_current)->request_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::ReadBuffersRequest>;
    iVar3._M_current =
         (pSVar1->methods).
         super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (pSVar1->methods).
    super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_38.name = "FreeBuffers";
  local_38.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::FreeBuffersRequest>;
  local_38.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::FreeBuffersResponse>;
  local_38.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::FreeBuffersRequest,_perfetto::protos::gen::FreeBuffersResponse,_&perfetto::protos::gen::ConsumerPort::FreeBuffers>
  ;
  if (iVar3._M_current ==
      (pSVar1->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ::_M_realloc_insert<perfetto::ipc::ServiceDescriptor::Method>(this,iVar3,&local_38);
    iVar3._M_current =
         (pSVar1->methods).
         super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (iVar3._M_current)->reply_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::FreeBuffersResponse>;
    (iVar3._M_current)->invoker =
         _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::FreeBuffersRequest,_perfetto::protos::gen::FreeBuffersResponse,_&perfetto::protos::gen::ConsumerPort::FreeBuffers>
    ;
    (iVar3._M_current)->name = "FreeBuffers";
    (iVar3._M_current)->request_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::FreeBuffersRequest>;
    iVar3._M_current =
         (pSVar1->methods).
         super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (pSVar1->methods).
    super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_38.name = "Flush";
  local_38.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::FlushRequest>;
  local_38.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::FlushResponse>;
  local_38.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::FlushRequest,_perfetto::protos::gen::FlushResponse,_&perfetto::protos::gen::ConsumerPort::Flush>
  ;
  if (iVar3._M_current ==
      (pSVar1->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ::_M_realloc_insert<perfetto::ipc::ServiceDescriptor::Method>(this,iVar3,&local_38);
    iVar3._M_current =
         (pSVar1->methods).
         super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (iVar3._M_current)->reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::FlushResponse>;
    (iVar3._M_current)->invoker =
         _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::FlushRequest,_perfetto::protos::gen::FlushResponse,_&perfetto::protos::gen::ConsumerPort::Flush>
    ;
    (iVar3._M_current)->name = "Flush";
    (iVar3._M_current)->request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::FlushRequest>;
    iVar3._M_current =
         (pSVar1->methods).
         super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (pSVar1->methods).
    super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_38.name = "StartTracing";
  local_38.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::StartTracingRequest>;
  local_38.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::StartTracingResponse>;
  local_38.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::StartTracingRequest,_perfetto::protos::gen::StartTracingResponse,_&perfetto::protos::gen::ConsumerPort::StartTracing>
  ;
  if (iVar3._M_current ==
      (pSVar1->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ::_M_realloc_insert<perfetto::ipc::ServiceDescriptor::Method>(this,iVar3,&local_38);
    iVar3._M_current =
         (pSVar1->methods).
         super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (iVar3._M_current)->reply_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::StartTracingResponse>;
    (iVar3._M_current)->invoker =
         _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::StartTracingRequest,_perfetto::protos::gen::StartTracingResponse,_&perfetto::protos::gen::ConsumerPort::StartTracing>
    ;
    (iVar3._M_current)->name = "StartTracing";
    (iVar3._M_current)->request_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::StartTracingRequest>;
    iVar3._M_current =
         (pSVar1->methods).
         super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (pSVar1->methods).
    super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_38.name = "ChangeTraceConfig";
  local_38.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::ChangeTraceConfigRequest>;
  local_38.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::ChangeTraceConfigResponse>;
  local_38.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::ChangeTraceConfigRequest,_perfetto::protos::gen::ChangeTraceConfigResponse,_&perfetto::protos::gen::ConsumerPort::ChangeTraceConfig>
  ;
  if (iVar3._M_current ==
      (pSVar1->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ::_M_realloc_insert<perfetto::ipc::ServiceDescriptor::Method>(this,iVar3,&local_38);
    iVar3._M_current =
         (pSVar1->methods).
         super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (iVar3._M_current)->reply_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::ChangeTraceConfigResponse>;
    (iVar3._M_current)->invoker =
         _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::ChangeTraceConfigRequest,_perfetto::protos::gen::ChangeTraceConfigResponse,_&perfetto::protos::gen::ConsumerPort::ChangeTraceConfig>
    ;
    (iVar3._M_current)->name = "ChangeTraceConfig";
    (iVar3._M_current)->request_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::ChangeTraceConfigRequest>;
    iVar3._M_current =
         (pSVar1->methods).
         super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (pSVar1->methods).
    super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_38.name = "Detach";
  local_38.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::DetachRequest>;
  local_38.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::DetachResponse>;
  local_38.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::DetachRequest,_perfetto::protos::gen::DetachResponse,_&perfetto::protos::gen::ConsumerPort::Detach>
  ;
  if (iVar3._M_current ==
      (pSVar1->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ::_M_realloc_insert<perfetto::ipc::ServiceDescriptor::Method>(this,iVar3,&local_38);
    iVar3._M_current =
         (pSVar1->methods).
         super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (iVar3._M_current)->reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::DetachResponse>;
    (iVar3._M_current)->invoker =
         _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::DetachRequest,_perfetto::protos::gen::DetachResponse,_&perfetto::protos::gen::ConsumerPort::Detach>
    ;
    (iVar3._M_current)->name = "Detach";
    (iVar3._M_current)->request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::DetachRequest>;
    iVar3._M_current =
         (pSVar1->methods).
         super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (pSVar1->methods).
    super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_38.name = "Attach";
  local_38.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::AttachRequest>;
  local_38.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::AttachResponse>;
  local_38.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::AttachRequest,_perfetto::protos::gen::AttachResponse,_&perfetto::protos::gen::ConsumerPort::Attach>
  ;
  if (iVar3._M_current ==
      (pSVar1->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ::_M_realloc_insert<perfetto::ipc::ServiceDescriptor::Method>(this,iVar3,&local_38);
    iVar3._M_current =
         (pSVar1->methods).
         super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (iVar3._M_current)->reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::AttachResponse>;
    (iVar3._M_current)->invoker =
         _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::AttachRequest,_perfetto::protos::gen::AttachResponse,_&perfetto::protos::gen::ConsumerPort::Attach>
    ;
    (iVar3._M_current)->name = "Attach";
    (iVar3._M_current)->request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::AttachRequest>;
    iVar3._M_current =
         (pSVar1->methods).
         super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (pSVar1->methods).
    super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_38.name = "GetTraceStats";
  local_38.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::GetTraceStatsRequest>;
  local_38.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::GetTraceStatsResponse>;
  local_38.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::GetTraceStatsRequest,_perfetto::protos::gen::GetTraceStatsResponse,_&perfetto::protos::gen::ConsumerPort::GetTraceStats>
  ;
  if (iVar3._M_current ==
      (pSVar1->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ::_M_realloc_insert<perfetto::ipc::ServiceDescriptor::Method>(this,iVar3,&local_38);
    iVar3._M_current =
         (pSVar1->methods).
         super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (iVar3._M_current)->reply_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::GetTraceStatsResponse>;
    (iVar3._M_current)->invoker =
         _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::GetTraceStatsRequest,_perfetto::protos::gen::GetTraceStatsResponse,_&perfetto::protos::gen::ConsumerPort::GetTraceStats>
    ;
    (iVar3._M_current)->name = "GetTraceStats";
    (iVar3._M_current)->request_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::GetTraceStatsRequest>;
    iVar3._M_current =
         (pSVar1->methods).
         super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (pSVar1->methods).
    super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_38.name = "ObserveEvents";
  local_38.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::ObserveEventsRequest>;
  local_38.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::ObserveEventsResponse>;
  local_38.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::ObserveEventsRequest,_perfetto::protos::gen::ObserveEventsResponse,_&perfetto::protos::gen::ConsumerPort::ObserveEvents>
  ;
  if (iVar3._M_current ==
      (pSVar1->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ::_M_realloc_insert<perfetto::ipc::ServiceDescriptor::Method>(this,iVar3,&local_38);
    iVar3._M_current =
         (pSVar1->methods).
         super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (iVar3._M_current)->reply_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::ObserveEventsResponse>;
    (iVar3._M_current)->invoker =
         _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::ObserveEventsRequest,_perfetto::protos::gen::ObserveEventsResponse,_&perfetto::protos::gen::ConsumerPort::ObserveEvents>
    ;
    (iVar3._M_current)->name = "ObserveEvents";
    (iVar3._M_current)->request_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::ObserveEventsRequest>;
    iVar3._M_current =
         (pSVar1->methods).
         super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (pSVar1->methods).
    super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_38.name = "QueryServiceState";
  local_38.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::QueryServiceStateRequest>;
  local_38.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::QueryServiceStateResponse>;
  local_38.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::QueryServiceStateRequest,_perfetto::protos::gen::QueryServiceStateResponse,_&perfetto::protos::gen::ConsumerPort::QueryServiceState>
  ;
  if (iVar3._M_current ==
      (pSVar1->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ::_M_realloc_insert<perfetto::ipc::ServiceDescriptor::Method>(this,iVar3,&local_38);
    iVar3._M_current =
         (pSVar1->methods).
         super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (iVar3._M_current)->reply_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::QueryServiceStateResponse>;
    (iVar3._M_current)->invoker =
         _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::QueryServiceStateRequest,_perfetto::protos::gen::QueryServiceStateResponse,_&perfetto::protos::gen::ConsumerPort::QueryServiceState>
    ;
    (iVar3._M_current)->name = "QueryServiceState";
    (iVar3._M_current)->request_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::QueryServiceStateRequest>;
    iVar3._M_current =
         (pSVar1->methods).
         super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (pSVar1->methods).
    super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_38.name = "QueryCapabilities";
  local_38.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::QueryCapabilitiesRequest>;
  local_38.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::QueryCapabilitiesResponse>;
  local_38.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::QueryCapabilitiesRequest,_perfetto::protos::gen::QueryCapabilitiesResponse,_&perfetto::protos::gen::ConsumerPort::QueryCapabilities>
  ;
  if (iVar3._M_current ==
      (pSVar1->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ::_M_realloc_insert<perfetto::ipc::ServiceDescriptor::Method>(this,iVar3,&local_38);
    iVar3._M_current =
         (pSVar1->methods).
         super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (iVar3._M_current)->reply_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::QueryCapabilitiesResponse>;
    (iVar3._M_current)->invoker =
         _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::QueryCapabilitiesRequest,_perfetto::protos::gen::QueryCapabilitiesResponse,_&perfetto::protos::gen::ConsumerPort::QueryCapabilities>
    ;
    (iVar3._M_current)->name = "QueryCapabilities";
    (iVar3._M_current)->request_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::QueryCapabilitiesRequest>;
    iVar3._M_current =
         (pSVar1->methods).
         super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (pSVar1->methods).
    super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_38.name = "SaveTraceForBugreport";
  local_38.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::SaveTraceForBugreportRequest>
  ;
  local_38.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::SaveTraceForBugreportResponse>;
  local_38.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::SaveTraceForBugreportRequest,_perfetto::protos::gen::SaveTraceForBugreportResponse,_&perfetto::protos::gen::ConsumerPort::SaveTraceForBugreport>
  ;
  if (iVar3._M_current ==
      (pSVar1->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ::_M_realloc_insert<perfetto::ipc::ServiceDescriptor::Method>(this,iVar3,&local_38);
    pMVar2 = (pSVar1->methods).
             super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (iVar3._M_current)->reply_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::SaveTraceForBugreportResponse>;
    (iVar3._M_current)->invoker =
         _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::SaveTraceForBugreportRequest,_perfetto::protos::gen::SaveTraceForBugreportResponse,_&perfetto::protos::gen::ConsumerPort::SaveTraceForBugreport>
    ;
    (iVar3._M_current)->name = "SaveTraceForBugreport";
    (iVar3._M_current)->request_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::SaveTraceForBugreportRequest>;
    pMVar2 = (pSVar1->methods).
             super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
    (pSVar1->methods).
    super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar2;
  }
  if ((pSVar1->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != pMVar2) {
    std::
    __shrink_to_fit_aux<std::vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>,_true>
    ::_S_do_it(this);
  }
  return pSVar1;
}

Assistant:

::perfetto::ipc::ServiceDescriptor* ConsumerPort::NewDescriptor() {
  auto* desc = new ::perfetto::ipc::ServiceDescriptor();
  desc->service_name = "ConsumerPort";

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "EnableTracing",
     &_IPC_Decoder<EnableTracingRequest>,
     &_IPC_Decoder<EnableTracingResponse>,
     &_IPC_Invoker<ConsumerPort, EnableTracingRequest, EnableTracingResponse, &ConsumerPort::EnableTracing>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "DisableTracing",
     &_IPC_Decoder<DisableTracingRequest>,
     &_IPC_Decoder<DisableTracingResponse>,
     &_IPC_Invoker<ConsumerPort, DisableTracingRequest, DisableTracingResponse, &ConsumerPort::DisableTracing>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "ReadBuffers",
     &_IPC_Decoder<ReadBuffersRequest>,
     &_IPC_Decoder<ReadBuffersResponse>,
     &_IPC_Invoker<ConsumerPort, ReadBuffersRequest, ReadBuffersResponse, &ConsumerPort::ReadBuffers>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "FreeBuffers",
     &_IPC_Decoder<FreeBuffersRequest>,
     &_IPC_Decoder<FreeBuffersResponse>,
     &_IPC_Invoker<ConsumerPort, FreeBuffersRequest, FreeBuffersResponse, &ConsumerPort::FreeBuffers>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "Flush",
     &_IPC_Decoder<FlushRequest>,
     &_IPC_Decoder<FlushResponse>,
     &_IPC_Invoker<ConsumerPort, FlushRequest, FlushResponse, &ConsumerPort::Flush>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "StartTracing",
     &_IPC_Decoder<StartTracingRequest>,
     &_IPC_Decoder<StartTracingResponse>,
     &_IPC_Invoker<ConsumerPort, StartTracingRequest, StartTracingResponse, &ConsumerPort::StartTracing>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "ChangeTraceConfig",
     &_IPC_Decoder<ChangeTraceConfigRequest>,
     &_IPC_Decoder<ChangeTraceConfigResponse>,
     &_IPC_Invoker<ConsumerPort, ChangeTraceConfigRequest, ChangeTraceConfigResponse, &ConsumerPort::ChangeTraceConfig>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "Detach",
     &_IPC_Decoder<DetachRequest>,
     &_IPC_Decoder<DetachResponse>,
     &_IPC_Invoker<ConsumerPort, DetachRequest, DetachResponse, &ConsumerPort::Detach>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "Attach",
     &_IPC_Decoder<AttachRequest>,
     &_IPC_Decoder<AttachResponse>,
     &_IPC_Invoker<ConsumerPort, AttachRequest, AttachResponse, &ConsumerPort::Attach>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "GetTraceStats",
     &_IPC_Decoder<GetTraceStatsRequest>,
     &_IPC_Decoder<GetTraceStatsResponse>,
     &_IPC_Invoker<ConsumerPort, GetTraceStatsRequest, GetTraceStatsResponse, &ConsumerPort::GetTraceStats>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "ObserveEvents",
     &_IPC_Decoder<ObserveEventsRequest>,
     &_IPC_Decoder<ObserveEventsResponse>,
     &_IPC_Invoker<ConsumerPort, ObserveEventsRequest, ObserveEventsResponse, &ConsumerPort::ObserveEvents>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "QueryServiceState",
     &_IPC_Decoder<QueryServiceStateRequest>,
     &_IPC_Decoder<QueryServiceStateResponse>,
     &_IPC_Invoker<ConsumerPort, QueryServiceStateRequest, QueryServiceStateResponse, &ConsumerPort::QueryServiceState>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "QueryCapabilities",
     &_IPC_Decoder<QueryCapabilitiesRequest>,
     &_IPC_Decoder<QueryCapabilitiesResponse>,
     &_IPC_Invoker<ConsumerPort, QueryCapabilitiesRequest, QueryCapabilitiesResponse, &ConsumerPort::QueryCapabilities>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "SaveTraceForBugreport",
     &_IPC_Decoder<SaveTraceForBugreportRequest>,
     &_IPC_Decoder<SaveTraceForBugreportResponse>,
     &_IPC_Invoker<ConsumerPort, SaveTraceForBugreportRequest, SaveTraceForBugreportResponse, &ConsumerPort::SaveTraceForBugreport>});
  desc->methods.shrink_to_fit();
  return desc;
}